

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

bool __thiscall
QIconModeViewBase::doBatchedItemLayout(QIconModeViewBase *this,QListViewLayoutInfo *info,int max)

{
  QListView *pQVar1;
  QListViewPrivate *pQVar2;
  QAbstractItemModel *pQVar3;
  bool bVar4;
  QSize QVar5;
  int iVar6;
  int iVar7;
  long in_FS_OFFSET;
  QStyleOptionViewItem option;
  QModelIndex local_138;
  QModelIndex local_120;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->items).d.size <= (long)info->last) {
    memset(&local_108,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
    pQVar1 = (this->super_QCommonListViewBase).qq;
    (**(code **)(*(long *)&(pQVar1->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x2f8))(pQVar1,&local_108);
    iVar7 = (int)(this->items).d.size;
    if (iVar7 <= info->last) {
      do {
        pQVar2 = (this->super_QCommonListViewBase).dd;
        pQVar3 = (pQVar2->super_QAbstractItemViewPrivate).model;
        iVar6 = pQVar2->column;
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  (&local_120,&(pQVar2->super_QAbstractItemViewPrivate).root);
        (**(code **)(*(long *)pQVar3 + 0x60))(&local_138,pQVar3,iVar7,iVar6,&local_120);
        QVar5 = QListViewPrivate::itemSize
                          ((this->super_QCommonListViewBase).dd,&local_108,&local_138);
        local_120.r = 0;
        local_120.c = 0;
        local_120.i._0_2_ = (undefined2)QVar5.wd.m_i;
        if (0x7ffe < QVar5.wd.m_i.m_i) {
          local_120.i._0_2_ = 0x7fff;
        }
        iVar6 = (int)((ulong)((long)QVar5 + -0x100000000) >> 0x20) + 1;
        local_120.i._2_2_ = (undefined2)iVar6;
        if (0x7ffe < iVar6) {
          local_120.i._2_2_ = 0x7fff;
        }
        local_120.m.ptr._0_4_ = 0xffff;
        local_120.i._4_4_ = iVar7;
        QtPrivate::QPodArrayOps<QListViewItem>::emplace<QListViewItem_const&>
                  ((QPodArrayOps<QListViewItem> *)&this->items,(this->items).d.size,
                   (QListViewItem *)&local_120);
        QList<QListViewItem>::end(&this->items);
        bVar4 = iVar7 < info->last;
        iVar7 = iVar7 + 1;
      } while (bVar4);
    }
    doDynamicLayout(this,info);
    QBrush::~QBrush(&local_108.backgroundBrush);
    if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    QIcon::~QIcon(&local_108.icon);
    QLocale::~QLocale(&local_108.locale);
    QFont::~QFont(&local_108.font);
    QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return max < (this->super_QCommonListViewBase).batchStartRow;
  }
  __stack_chk_fail();
}

Assistant:

bool QIconModeViewBase::doBatchedItemLayout(const QListViewLayoutInfo &info, int max)
{
    if (info.last >= items.size()) {
        //first we create the items
        QStyleOptionViewItem option;
        initViewItemOption(&option);
        for (int row = items.size(); row <= info.last; ++row) {
            QSize size = itemSize(option, modelIndex(row));
            QListViewItem item(QRect(0, 0, size.width(), size.height()), row); // default pos
            items.append(item);
        }
        doDynamicLayout(info);
    }
    return (batchStartRow > max); // done
}